

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O0

base_learner * active_setup(options_i *options,vw *all)

{
  byte bVar1;
  pointer paVar2;
  undefined8 uVar3;
  vw *in_RSI;
  long *in_RDI;
  learner<active,_example> *l;
  single_learner *base;
  stringstream __msg;
  option_group_definition new_options;
  bool simulation;
  bool active_option;
  free_ptr<active> data;
  string *in_stack_fffffffffffff9a8;
  vw *in_stack_fffffffffffff9b0;
  string *in_stack_fffffffffffff9b8;
  undefined7 in_stack_fffffffffffff9c0;
  byte in_stack_fffffffffffff9c7;
  string *in_stack_fffffffffffff9c8;
  undefined8 in_stack_fffffffffffff9d0;
  int plineNumber;
  allocator *paVar4;
  char *in_stack_fffffffffffff9d8;
  vw_exception *in_stack_fffffffffffff9e0;
  typed_option<float> *in_stack_fffffffffffff9f8;
  vw *pvVar5;
  option_group_definition *in_stack_fffffffffffffa00;
  long *plVar6;
  allocator local_579;
  string local_578 [32];
  vw *local_558;
  single_learner *local_550;
  undefined1 local_541;
  stringstream local_520 [16];
  stringstream local_510 [128];
  learner<char,_char> *in_stack_fffffffffffffb70;
  allocator local_391;
  string local_390 [32];
  undefined4 local_370;
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [199];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [199];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<bool> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [62];
  undefined1 local_2a;
  byte local_29;
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<active>();
  local_29 = 0;
  local_2a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Active Learning",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"active",&local_161);
  VW::config::make_option<bool>(in_stack_fffffffffffff9b8,(bool *)in_stack_fffffffffffff9b0);
  VW::config::typed_option<bool>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"enable active learning",&local_189);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffffa00,(typed_option<bool> *)in_stack_fffffffffffff9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"simulation",&local_251);
  VW::config::make_option<bool>(in_stack_fffffffffffff9b8,(bool *)in_stack_fffffffffffff9b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"active learning simulation mode",&local_279);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffffa00,(typed_option<bool> *)in_stack_fffffffffffff9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"mellowness",&local_341);
  std::unique_ptr<active,_void_(*)(void_*)>::operator->
            ((unique_ptr<active,_void_(*)(void_*)> *)0x2bbf9a);
  VW::config::make_option<float>(in_stack_fffffffffffff9b8,(float *)in_stack_fffffffffffff9b0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
             (float)((ulong)in_stack_fffffffffffff9b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_368,"active learning mellowness parameter c_0. Default 8",&local_369);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff9b0);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff9b0);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff9b0);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  (**(code **)*local_10)(local_10,local_68);
  if ((local_29 & 1) == 0) {
    local_8 = (base_learner *)0x0;
  }
  else {
    pvVar5 = local_18;
    paVar2 = std::unique_ptr<active,_void_(*)(void_*)>::operator->
                       ((unique_ptr<active,_void_(*)(void_*)> *)0x2bc3c5);
    paVar2->all = pvVar5;
    plVar6 = local_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"lda",&local_391);
    bVar1 = (**(code **)(*plVar6 + 8))(plVar6,local_390);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    if ((bVar1 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_520);
      std::operator<<((ostream *)(local_520 + 0x10),
                      "error: you can\'t combine lda and active learning");
      local_541 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8,plineNumber,
                 in_stack_fffffffffffff9c8);
      local_541 = 0;
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    setup_base((options_i *)in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
    local_550 = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffb70);
    paVar4 = &local_579;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_578,"simulation",paVar4);
    in_stack_fffffffffffff9c7 = (**(code **)(*local_10 + 8))(local_10,local_578);
    std::__cxx11::string::~string(local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    if ((in_stack_fffffffffffff9c7 & 1) == 0) {
      local_18->active = true;
      in_stack_fffffffffffff9b0 =
           (vw *)LEARNER::init_learner<active,example,LEARNER::learner<char,example>>
                           ((free_ptr<active> *)
                            CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                            (learner<char,_example> *)in_stack_fffffffffffff9b8,
                            (_func_void_active_ptr_learner<char,_example>_ptr_example_ptr *)
                            in_stack_fffffffffffff9b0,
                            (_func_void_active_ptr_learner<char,_example>_ptr_example_ptr *)
                            in_stack_fffffffffffff9a8);
      local_558 = in_stack_fffffffffffff9b0;
      LEARNER::learner<active,_example>::set_finish_example
                ((learner<active,_example> *)in_stack_fffffffffffff9b0,return_active_example);
    }
    else {
      local_558 = (vw *)LEARNER::init_learner<active,example,LEARNER::learner<char,example>>
                                  ((free_ptr<active> *)
                                   CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                                   (learner<char,_example> *)in_stack_fffffffffffff9b8,
                                   (_func_void_active_ptr_learner<char,_example>_ptr_example_ptr *)
                                   in_stack_fffffffffffff9b0,
                                   (_func_void_active_ptr_learner<char,_example>_ptr_example_ptr *)
                                   in_stack_fffffffffffff9a8);
    }
    local_8 = LEARNER::make_base<active,example>((learner<active,_example> *)local_558);
  }
  local_370 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff9b0);
  std::unique_ptr<active,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<active,_void_(*)(void_*)> *)
             CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0));
  return local_8;
}

Assistant:

base_learner* active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active>();

  bool active_option = false;
  bool simulation = false;
  option_group_definition new_options("Active Learning");
  new_options.add(make_option("active", active_option).keep().help("enable active learning"))
      .add(make_option("simulation", simulation).help("active learning simulation mode"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8"));
  options.add_and_parse(new_options);

  if (!active_option)
    return nullptr;

  data->all = &all;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  auto base = as_singleline(setup_base(options, all));

  // Create new learner
  learner<active, example>* l;
  if (options.was_supplied("simulation"))
    l = &init_learner(data, base, predict_or_learn_simulation<true>, predict_or_learn_simulation<false>);
  else
  {
    all.active = true;
    l = &init_learner(data, base, predict_or_learn_active<true>, predict_or_learn_active<false>);
    l->set_finish_example(return_active_example);
  }

  return make_base(*l);
}